

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::setTo
          (UnicodeString *this,UChar *buffer,int32_t buffLength,int32_t buffCapacity)

{
  long lVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x10) ==
      (undefined1  [56])0x0) {
    if (buffer == (UChar *)0x0) {
      releaseArray(this);
      (this->fUnion).fStackFields.fLengthAndFlags = 2;
    }
    else if (((buffCapacity < buffLength) || (buffLength < -1)) || (buffCapacity < 0)) {
      setToBogus(this);
    }
    else {
      if (buffLength == -1) {
        lVar1 = (ulong)(uint)buffCapacity * 2;
        for (pUVar2 = buffer;
            (pUVar3 = buffer + (uint)buffCapacity, lVar1 != 0 && (pUVar3 = pUVar2, *pUVar2 != L'\0')
            ); pUVar2 = pUVar2 + 1) {
          lVar1 = lVar1 + -2;
        }
        buffLength = (int32_t)((ulong)((long)pUVar3 - (long)buffer) >> 1);
      }
      releaseArray(this);
      (this->fUnion).fStackFields.fLengthAndFlags = 0;
      setLength(this,buffLength);
      (this->fUnion).fFields.fArray = buffer;
      (this->fUnion).fFields.fCapacity = buffCapacity;
    }
  }
  return this;
}

Assistant:

UnicodeString &
UnicodeString::setTo(UChar *buffer,
                     int32_t buffLength,
                     int32_t buffCapacity) {
  if(fUnion.fFields.fLengthAndFlags & kOpenGetBuffer) {
    // do not modify a string that has an "open" getBuffer(minCapacity)
    return *this;
  }

  if(buffer == NULL) {
    // treat as an empty string, do not alias
    releaseArray();
    setToEmpty();
    return *this;
  }

  if(buffLength < -1 || buffCapacity < 0 || buffLength > buffCapacity) {
    setToBogus();
    return *this;
  } else if(buffLength == -1) {
    // buffLength = u_strlen(buff); but do not look beyond buffCapacity
    const UChar *p = buffer, *limit = buffer + buffCapacity;
    while(p != limit && *p != 0) {
      ++p;
    }
    buffLength = (int32_t)(p - buffer);
  }

  releaseArray();

  fUnion.fFields.fLengthAndFlags = kWritableAlias;
  setArray(buffer, buffLength, buffCapacity);
  return *this;
}